

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# substring.cpp
# Opt level: O1

void duckdb::SubstringFunction<duckdb::SubstringUnicodeOp>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  ulong *puVar1;
  VectorType VVar2;
  VectorType VVar3;
  unsigned_long *puVar4;
  __uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_> _Var5;
  data_ptr_t pdVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  sel_t *psVar8;
  sel_t *psVar9;
  byte bVar10;
  element_type *peVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var12;
  SelectionVector *pSVar13;
  reference vector;
  reference vector_00;
  reference this;
  idx_t iVar14;
  TemplatedValidityData<unsigned_long> *pTVar15;
  idx_t iVar16;
  ulong uVar17;
  ulong uVar18;
  undefined8 uVar19;
  anon_union_16_2_67f50693_for_value *paVar21;
  long lVar22;
  data_ptr_t pdVar23;
  Vector *pVVar24;
  idx_t iVar25;
  int64_t offset;
  int64_t in_R9;
  idx_t idx_in_entry;
  idx_t iVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  data_ptr_t pdVar30;
  idx_t iVar31;
  data_ptr_t pdVar32;
  unsigned_long uVar33;
  string_t sVar34;
  anon_struct_16_3_d7536bce_for_pointer aVar35;
  string_t input;
  string_t input_00;
  string_t input_01;
  string_t input_02;
  string_t input_03;
  string_t input_04;
  string_t input_05;
  string_t input_06;
  string_t input_07;
  string_t input_08;
  string_t input_09;
  string_t input_10;
  string_t input_11;
  UnifiedVectorFormat bdata;
  UnifiedVectorFormat adata;
  element_type *local_128;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_120;
  idx_t local_110;
  UnifiedVectorFormat local_108;
  UnifiedVectorFormat local_c0;
  UnifiedVectorFormat local_78;
  undefined8 uVar20;
  
  vector = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  vector_00 = vector<duckdb::Vector,_true>::operator[](&args->data,1);
  if ((long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
            super__Vector_impl_data._M_start == 0x138) {
    this = vector<duckdb::Vector,_true>::operator[](&args->data,2);
    iVar31 = args->count;
    if (((vector->vector_type != CONSTANT_VECTOR) || (vector_00->vector_type != CONSTANT_VECTOR)) ||
       (this->vector_type != CONSTANT_VECTOR)) {
      Vector::SetVectorType(result,FLAT_VECTOR);
      UnifiedVectorFormat::UnifiedVectorFormat(&local_c0);
      UnifiedVectorFormat::UnifiedVectorFormat(&local_108);
      UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
      Vector::ToUnifiedFormat(vector,iVar31,&local_c0);
      Vector::ToUnifiedFormat(vector_00,iVar31,&local_108);
      Vector::ToUnifiedFormat(this,iVar31,&local_78);
      pdVar6 = local_78.data;
      pSVar13 = local_78.sel;
      pdVar32 = result->data;
      FlatVector::VerifyFlatVector(result);
      if (((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) &&
          (local_108.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0)) &&
         (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0)) {
        if (iVar31 != 0) {
          pdVar32 = pdVar32 + 8;
          iVar26 = 0;
          do {
            iVar14 = iVar26;
            if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
              iVar14 = (idx_t)(local_c0.sel)->sel_vector[iVar26];
            }
            iVar16 = iVar26;
            if ((local_108.sel)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(local_108.sel)->sel_vector[iVar26];
            }
            _Var5._M_t.
            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
            super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
                 (((unsafe_unique_array<unsigned_long> *)&pSVar13->sel_vector)->
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t;
            iVar25 = iVar26;
            if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
                _Var5._M_t.
                super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0)
            {
              iVar25 = (idx_t)*(uint *)((long)_Var5._M_t.
                                              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                              .super__Head_base<0UL,_unsigned_long_*,_false>.
                                              _M_head_impl + iVar26 * 4);
            }
            input.value.pointer.ptr = (char *)*(undefined8 *)(local_108.data + iVar16 * 8);
            input.value._0_8_ = *(undefined8 *)(local_c0.data + iVar14 * 0x10 + 8);
            sVar34 = SubstringUnicode((duckdb *)result,*(Vector **)(local_c0.data + iVar14 * 0x10),
                                      input,(int64_t)((_func_int ***)pdVar6)[iVar25],in_R9);
            *(long *)(pdVar32 + -8) = sVar34.value._0_8_;
            *(long *)pdVar32 = sVar34.value._8_8_;
            iVar26 = iVar26 + 1;
            pdVar32 = pdVar32 + 0x10;
          } while (iVar31 != iVar26);
        }
      }
      else if (iVar31 != 0) {
        pdVar32 = pdVar32 + 8;
        uVar28 = 0;
        do {
          uVar17 = uVar28;
          if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
            uVar17 = (ulong)(local_c0.sel)->sel_vector[uVar28];
          }
          uVar18 = uVar28;
          if ((local_108.sel)->sel_vector != (sel_t *)0x0) {
            uVar18 = (ulong)(local_108.sel)->sel_vector[uVar28];
          }
          _Var5._M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
          super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               (((unsafe_unique_array<unsigned_long> *)&pSVar13->sel_vector)->
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t;
          uVar27 = uVar28;
          if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
              _Var5._M_t.
              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
              super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0) {
            uVar27 = (ulong)*(uint *)((long)_Var5._M_t.
                                            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                            .super__Head_base<0UL,_unsigned_long_*,_false>.
                                            _M_head_impl + uVar28 * 4);
          }
          if ((((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                 (unsigned_long *)0x0) ||
               ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                 [uVar17 >> 6] >> (uVar17 & 0x3f) & 1) != 0)) &&
              ((local_108.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0 ||
               ((local_108.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                 [uVar18 >> 6] >> (uVar18 & 0x3f) & 1) != 0)))) &&
             ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
               (unsigned_long *)0x0 ||
              ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                [uVar27 >> 6] >> (uVar27 & 0x3f) & 1) != 0)))) {
            input_02.value.pointer.ptr = (char *)*(undefined8 *)(local_108.data + uVar18 * 8);
            input_02.value._0_8_ = *(undefined8 *)(local_c0.data + uVar17 * 0x10 + 8);
            sVar34 = SubstringUnicode((duckdb *)result,*(Vector **)(local_c0.data + uVar17 * 0x10),
                                      input_02,(int64_t)((_func_int ***)pdVar6)[uVar27],in_R9);
            *(long *)(pdVar32 + -8) = sVar34.value._0_8_;
            *(long *)pdVar32 = sVar34.value._8_8_;
          }
          else {
            if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              local_110 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_128,&local_110);
              p_Var12 = p_Stack_120;
              peVar11 = local_128;
              local_128 = (element_type *)0x0;
              p_Stack_120 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              p_Var7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = peVar11;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = p_Var12;
              if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
              }
              if (p_Stack_120 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_120);
              }
              pTVar15 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                    validity_data);
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   (unsigned_long *)
                   (pTVar15->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>;
            }
            bVar10 = (byte)uVar28 & 0x3f;
            puVar1 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                     (uVar28 >> 6);
            *puVar1 = *puVar1 & (-2L << bVar10 | 0xfffffffffffffffeU >> 0x40 - bVar10);
          }
          uVar28 = uVar28 + 1;
          pdVar32 = pdVar32 + 0x10;
        } while (iVar31 != uVar28);
      }
      if (local_78.owned_sel.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_78.owned_sel.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
LAB_009fe29e:
      if (local_108.owned_sel.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_108.owned_sel.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_108.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_108.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (local_c0.owned_sel.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_c0.owned_sel.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        return;
      }
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
      return;
    }
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    puVar4 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((((puVar4 == (unsigned_long *)0x0) || ((*puVar4 & 1) != 0)) &&
        ((puVar4 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
         puVar4 == (unsigned_long *)0x0 || ((*puVar4 & 1) != 0)))) &&
       ((puVar4 = (this->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
        puVar4 == (unsigned_long *)0x0 || ((*puVar4 & 1) != 0)))) {
      paVar21 = (anon_union_16_2_67f50693_for_value *)result->data;
      pVVar24 = *(Vector **)vector->data;
      uVar20 = *(undefined8 *)(vector->data + 8);
      uVar19 = *(undefined8 *)vector_00->data;
      offset = *(int64_t *)this->data;
LAB_009fe2fc:
      input_03.value.pointer.ptr = (char *)uVar19;
      input_03.value._0_8_ = uVar20;
      aVar35 = (anon_struct_16_3_d7536bce_for_pointer)
               SubstringUnicode((duckdb *)result,pVVar24,input_03,offset,in_R9);
      paVar21->pointer = aVar35;
      return;
    }
  }
  else {
    VVar2 = vector->vector_type;
    VVar3 = vector_00->vector_type;
    if ((VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
      puVar4 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      paVar21 = (anon_union_16_2_67f50693_for_value *)result->data;
      if (((puVar4 == (unsigned_long *)0x0) || ((*puVar4 & 1) != 0)) &&
         ((puVar4 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
          puVar4 == (unsigned_long *)0x0 || ((*puVar4 & 1) != 0)))) {
        pVVar24 = *(Vector **)vector->data;
        uVar20 = *(undefined8 *)(vector->data + 8);
        uVar19 = *(undefined8 *)vector_00->data;
        offset = 0xffffffff;
        goto LAB_009fe2fc;
      }
    }
    else {
      iVar31 = args->count;
      if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar2 == FLAT_VECTOR) {
        pdVar32 = vector->data;
        pdVar6 = vector_00->data;
        puVar4 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar4 == (unsigned_long *)0x0) || ((*puVar4 & 1) != 0)) {
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar23 = result->data;
          FlatVector::VerifyFlatVector(result);
          FlatVector::VerifyFlatVector(vector);
          FlatVector::VerifyFlatVector(result);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                    (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                     &(vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
               (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            if (iVar31 == 0) {
              return;
            }
            uVar20 = *(undefined8 *)pdVar6;
            lVar22 = 8;
            do {
              input_07.value.pointer.ptr = (char *)uVar20;
              input_07.value._0_8_ = *(undefined8 *)(pdVar32 + lVar22);
              sVar34 = SubstringUnicode((duckdb *)result,*(Vector **)(pdVar32 + lVar22 + -8),
                                        input_07,0xffffffff,in_R9);
              *(long *)(pdVar23 + lVar22 + -8) = sVar34.value._0_8_;
              *(long *)(pdVar23 + lVar22) = sVar34.value._8_8_;
              lVar22 = lVar22 + 0x10;
              iVar31 = iVar31 - 1;
            } while (iVar31 != 0);
            return;
          }
          if (iVar31 + 0x3f < 0x40) {
            return;
          }
          uVar17 = 0;
          uVar28 = 0;
          do {
            puVar4 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar4 == (unsigned_long *)0x0) {
              uVar33 = 0xffffffffffffffff;
            }
            else {
              uVar33 = puVar4[uVar17];
            }
            uVar18 = uVar28 + 0x40;
            if (iVar31 <= uVar28 + 0x40) {
              uVar18 = iVar31;
            }
            uVar27 = uVar18;
            if (uVar33 != 0) {
              uVar27 = uVar28;
              if (uVar33 == 0xffffffffffffffff) {
                if (uVar28 < uVar18) {
                  uVar20 = *(undefined8 *)pdVar6;
                  uVar28 = uVar28 << 4 | 8;
                  do {
                    input_00.value.pointer.ptr = (char *)uVar20;
                    input_00.value._0_8_ = *(undefined8 *)(pdVar32 + uVar28);
                    sVar34 = SubstringUnicode((duckdb *)result,*(Vector **)(pdVar32 + (uVar28 - 8)),
                                              input_00,0xffffffff,in_R9);
                    *(long *)(pdVar23 + (uVar28 - 8)) = sVar34.value._0_8_;
                    *(long *)(pdVar23 + uVar28) = sVar34.value._8_8_;
                    uVar27 = uVar27 + 1;
                    uVar28 = uVar28 + 0x10;
                  } while (uVar18 != uVar27);
                }
              }
              else if (uVar28 < uVar18) {
                uVar27 = uVar28 << 4 | 8;
                uVar29 = 0;
                do {
                  if ((uVar33 >> (uVar29 & 0x3f) & 1) != 0) {
                    input_01.value.pointer.ptr = (char *)*(undefined8 *)pdVar6;
                    input_01.value._0_8_ = *(undefined8 *)(pdVar32 + uVar27);
                    sVar34 = SubstringUnicode((duckdb *)result,*(Vector **)(pdVar32 + (uVar27 - 8)),
                                              input_01,0xffffffff,in_R9);
                    *(long *)(pdVar23 + (uVar27 - 8)) = sVar34.value._0_8_;
                    *(long *)(pdVar23 + uVar27) = sVar34.value._8_8_;
                  }
                  uVar29 = uVar29 + 1;
                  uVar27 = uVar27 + 0x10;
                } while ((uVar28 - uVar18) + uVar29 != 0);
                uVar27 = uVar28 + uVar29;
              }
            }
            uVar17 = uVar17 + 1;
            uVar28 = uVar27;
          } while (uVar17 != iVar31 + 0x3f >> 6);
          return;
        }
      }
      else {
        if ((VVar2 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar3 != FLAT_VECTOR) {
          if (VVar3 == FLAT_VECTOR && VVar2 == FLAT_VECTOR) {
            pdVar32 = vector->data;
            pdVar6 = vector_00->data;
            Vector::SetVectorType(result,FLAT_VECTOR);
            pdVar23 = result->data;
            FlatVector::VerifyFlatVector(result);
            FlatVector::VerifyFlatVector(vector);
            FlatVector::VerifyFlatVector(result);
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                 (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                      (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                       &(vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data)
            ;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
                 (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
            FlatVector::VerifyFlatVector(vector_00);
            ValidityMask::Combine(&result->validity,&vector_00->validity,iVar31);
            if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              if (iVar31 == 0) {
                return;
              }
              lVar22 = 0;
              do {
                sVar34.value.pointer.ptr = (char *)*(undefined8 *)(pdVar6 + lVar22);
                sVar34.value._0_8_ = *(undefined8 *)(pdVar32 + lVar22 * 2 + 8);
                sVar34 = SubstringUnicode((duckdb *)result,*(Vector **)(pdVar32 + lVar22 * 2),sVar34
                                          ,0xffffffff,in_R9);
                *(long *)(pdVar23 + lVar22 * 2) = sVar34.value._0_8_;
                *(long *)(pdVar23 + lVar22 * 2 + 8) = sVar34.value._8_8_;
                lVar22 = lVar22 + 8;
                iVar31 = iVar31 - 1;
              } while (iVar31 != 0);
              return;
            }
            if (iVar31 + 0x3f < 0x40) {
              return;
            }
            uVar17 = 0;
            uVar28 = 0;
            do {
              puVar4 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar4 == (unsigned_long *)0x0) {
                uVar33 = 0xffffffffffffffff;
              }
              else {
                uVar33 = puVar4[uVar17];
              }
              uVar18 = uVar28 + 0x40;
              if (iVar31 <= uVar28 + 0x40) {
                uVar18 = iVar31;
              }
              uVar27 = uVar18;
              if (uVar33 != 0) {
                uVar27 = uVar28;
                if (uVar33 == 0xffffffffffffffff) {
                  if (uVar28 < uVar18) {
                    lVar22 = uVar28 * 2 + 1;
                    do {
                      input_08.value.pointer.ptr = (char *)*(undefined8 *)(pdVar6 + uVar28 * 8);
                      input_08.value._0_8_ = *(undefined8 *)(pdVar32 + lVar22 * 8);
                      sVar34 = SubstringUnicode((duckdb *)result,
                                                *(Vector **)(pdVar32 + lVar22 * 8 + -8),input_08,
                                                0xffffffff,in_R9);
                      *(long *)(pdVar23 + lVar22 * 8 + -8) = sVar34.value._0_8_;
                      *(long *)(pdVar23 + lVar22 * 8) = sVar34.value._8_8_;
                      uVar28 = uVar28 + 1;
                      lVar22 = lVar22 + 2;
                      uVar27 = uVar28;
                    } while (uVar18 != uVar28);
                  }
                }
                else if (uVar28 < uVar18) {
                  lVar22 = uVar28 * 2 + 1;
                  uVar27 = 0;
                  do {
                    if ((uVar33 >> (uVar27 & 0x3f) & 1) != 0) {
                      input_09.value.pointer.ptr =
                           (char *)*(undefined8 *)(pdVar6 + uVar27 * 8 + uVar28 * 8);
                      input_09.value._0_8_ = *(undefined8 *)(pdVar32 + lVar22 * 8);
                      sVar34 = SubstringUnicode((duckdb *)result,
                                                *(Vector **)(pdVar32 + lVar22 * 8 + -8),input_09,
                                                0xffffffff,in_R9);
                      *(long *)(pdVar23 + lVar22 * 8 + -8) = sVar34.value._0_8_;
                      *(long *)(pdVar23 + lVar22 * 8) = sVar34.value._8_8_;
                    }
                    uVar27 = uVar27 + 1;
                    lVar22 = lVar22 + 2;
                  } while ((uVar28 - uVar18) + uVar27 != 0);
                  uVar27 = uVar28 + uVar27;
                }
              }
              uVar17 = uVar17 + 1;
              uVar28 = uVar27;
            } while (uVar17 != iVar31 + 0x3f >> 6);
            return;
          }
          UnifiedVectorFormat::UnifiedVectorFormat(&local_c0);
          UnifiedVectorFormat::UnifiedVectorFormat(&local_108);
          Vector::ToUnifiedFormat(vector,iVar31,&local_c0);
          Vector::ToUnifiedFormat(vector_00,iVar31,&local_108);
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar32 = result->data;
          FlatVector::VerifyFlatVector(result);
          if (local_108.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0 &&
              local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            if (iVar31 != 0) {
              psVar8 = (local_c0.sel)->sel_vector;
              psVar9 = (local_108.sel)->sel_vector;
              pdVar32 = pdVar32 + 8;
              iVar26 = 0;
              do {
                iVar14 = iVar26;
                if (psVar8 != (sel_t *)0x0) {
                  iVar14 = (idx_t)psVar8[iVar26];
                }
                iVar16 = iVar26;
                if (psVar9 != (sel_t *)0x0) {
                  iVar16 = (idx_t)psVar9[iVar26];
                }
                input_04.value.pointer.ptr = (char *)*(undefined8 *)(local_108.data + iVar16 * 8);
                input_04.value._0_8_ = *(undefined8 *)(local_c0.data + iVar14 * 0x10 + 8);
                sVar34 = SubstringUnicode((duckdb *)result,
                                          *(Vector **)(local_c0.data + iVar14 * 0x10),input_04,
                                          0xffffffff,in_R9);
                *(long *)(pdVar32 + -8) = sVar34.value._0_8_;
                *(long *)pdVar32 = sVar34.value._8_8_;
                iVar26 = iVar26 + 1;
                pdVar32 = pdVar32 + 0x10;
              } while (iVar31 != iVar26);
            }
          }
          else if (iVar31 != 0) {
            psVar8 = (local_c0.sel)->sel_vector;
            psVar9 = (local_108.sel)->sel_vector;
            pdVar32 = pdVar32 + 8;
            uVar28 = 0;
            do {
              uVar17 = uVar28;
              if (psVar8 != (sel_t *)0x0) {
                uVar17 = (ulong)psVar8[uVar28];
              }
              uVar18 = uVar28;
              if (psVar9 != (sel_t *)0x0) {
                uVar18 = (ulong)psVar9[uVar28];
              }
              if (((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                    (unsigned_long *)0x0) ||
                  ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [uVar17 >> 6] >> (uVar17 & 0x3f) & 1) != 0)) &&
                 ((local_108.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                   (unsigned_long *)0x0 ||
                  ((local_108.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [uVar18 >> 6] >> (uVar18 & 0x3f) & 1) != 0)))) {
                input_10.value.pointer.ptr = (char *)*(undefined8 *)(local_108.data + uVar18 * 8);
                input_10.value._0_8_ = *(undefined8 *)(local_c0.data + uVar17 * 0x10 + 8);
                sVar34 = SubstringUnicode((duckdb *)result,
                                          *(Vector **)(local_c0.data + uVar17 * 0x10),input_10,
                                          0xffffffff,in_R9);
                *(long *)(pdVar32 + -8) = sVar34.value._0_8_;
                *(long *)pdVar32 = sVar34.value._8_8_;
              }
              else {
                if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                    (unsigned_long *)0x0) {
                  local_128 = (element_type *)
                              (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity
                  ;
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)&local_78,(unsigned_long *)&local_128);
                  pdVar6 = local_78.data;
                  pSVar13 = local_78.sel;
                  local_78.sel = (SelectionVector *)0x0;
                  local_78.data = (data_ptr_t)0x0;
                  p_Var7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.
                           validity_data.internal.
                           super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = (element_type *)pSVar13;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar6;
                  if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
                  }
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.data !=
                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.data);
                  }
                  pTVar15 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->(&(result->validity).
                                        super_TemplatedValidityMask<unsigned_long>.validity_data);
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                       (unsigned_long *)
                       (pTVar15->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>;
                }
                bVar10 = (byte)uVar28 & 0x3f;
                puVar1 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask
                         + (uVar28 >> 6);
                *puVar1 = *puVar1 & (-2L << bVar10 | 0xfffffffffffffffeU >> 0x40 - bVar10);
              }
              uVar28 = uVar28 + 1;
              pdVar32 = pdVar32 + 0x10;
            } while (iVar31 != uVar28);
          }
          goto LAB_009fe29e;
        }
        pdVar32 = vector->data;
        puVar4 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar6 = vector_00->data;
        if ((puVar4 == (unsigned_long *)0x0) || ((*puVar4 & 1) != 0)) {
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar23 = result->data;
          FlatVector::VerifyFlatVector(result);
          FlatVector::VerifyFlatVector(vector_00);
          FlatVector::VerifyFlatVector(result);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                    (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                     &(vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_data
                    );
          (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
               (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            if (iVar31 == 0) {
              return;
            }
            pVVar24 = *(Vector **)pdVar32;
            uVar20 = *(undefined8 *)(pdVar32 + 8);
            pdVar23 = pdVar23 + 8;
            iVar26 = 0;
            do {
              input_11.value.pointer.ptr = (char *)*(undefined8 *)(pdVar6 + iVar26 * 8);
              input_11.value._0_8_ = uVar20;
              sVar34 = SubstringUnicode((duckdb *)result,pVVar24,input_11,0xffffffff,in_R9);
              *(long *)(pdVar23 + -8) = sVar34.value._0_8_;
              *(long *)pdVar23 = sVar34.value._8_8_;
              iVar26 = iVar26 + 1;
              pdVar23 = pdVar23 + 0x10;
            } while (iVar31 != iVar26);
            return;
          }
          if (iVar31 + 0x3f < 0x40) {
            return;
          }
          uVar17 = 0;
          uVar28 = 0;
          do {
            puVar4 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar4 == (unsigned_long *)0x0) {
              uVar33 = 0xffffffffffffffff;
            }
            else {
              uVar33 = puVar4[uVar17];
            }
            uVar18 = uVar28 + 0x40;
            if (iVar31 <= uVar28 + 0x40) {
              uVar18 = iVar31;
            }
            uVar27 = uVar18;
            if (uVar33 != 0) {
              uVar27 = uVar28;
              if (uVar33 == 0xffffffffffffffff) {
                if (uVar28 < uVar18) {
                  pVVar24 = *(Vector **)pdVar32;
                  uVar20 = *(undefined8 *)(pdVar32 + 8);
                  pdVar30 = pdVar23 + uVar28 * 0x10 + 8;
                  do {
                    input_05.value.pointer.ptr = (char *)*(undefined8 *)(pdVar6 + uVar27 * 8);
                    input_05.value._0_8_ = uVar20;
                    sVar34 = SubstringUnicode((duckdb *)result,pVVar24,input_05,0xffffffff,in_R9);
                    *(long *)(pdVar30 + -8) = sVar34.value._0_8_;
                    *(long *)pdVar30 = sVar34.value._8_8_;
                    uVar27 = uVar27 + 1;
                    pdVar30 = pdVar30 + 0x10;
                  } while (uVar18 != uVar27);
                }
              }
              else if (uVar28 < uVar18) {
                pdVar30 = pdVar23 + uVar28 * 0x10 + 8;
                uVar27 = 0;
                do {
                  if ((uVar33 >> (uVar27 & 0x3f) & 1) != 0) {
                    input_06.value.pointer.ptr =
                         (char *)*(undefined8 *)(pdVar6 + uVar27 * 8 + uVar28 * 8);
                    input_06.value._0_8_ = *(undefined8 *)(pdVar32 + 8);
                    sVar34 = SubstringUnicode((duckdb *)result,*(Vector **)pdVar32,input_06,
                                              0xffffffff,in_R9);
                    *(long *)(pdVar30 + -8) = sVar34.value._0_8_;
                    *(long *)pdVar30 = sVar34.value._8_8_;
                  }
                  uVar27 = uVar27 + 1;
                  pdVar30 = pdVar30 + 0x10;
                } while ((uVar28 - uVar18) + uVar27 != 0);
                uVar27 = uVar28 + uVar27;
              }
            }
            uVar17 = uVar17 + 1;
            uVar28 = uVar27;
          } while (uVar17 != iVar31 + 0x3f >> 6);
          return;
        }
      }
      Vector::SetVectorType(result,CONSTANT_VECTOR);
    }
  }
  ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void SubstringFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &input_vector = args.data[0];
	auto &offset_vector = args.data[1];
	if (args.ColumnCount() == 3) {
		auto &length_vector = args.data[2];

		TernaryExecutor::Execute<string_t, int64_t, int64_t, string_t>(
		    input_vector, offset_vector, length_vector, result, args.size(),
		    [&](string_t input_string, int64_t offset, int64_t length) {
			    return OP::Substring(result, input_string, offset, length);
		    });
	} else {
		BinaryExecutor::Execute<string_t, int64_t, string_t>(
		    input_vector, offset_vector, result, args.size(), [&](string_t input_string, int64_t offset) {
			    return OP::Substring(result, input_string, offset, NumericLimits<uint32_t>::Maximum());
		    });
	}
}